

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O0

void __thiscall duckdb::UniqueConstraint::Serialize(UniqueConstraint *this,Serializer *serializer)

{
  Constraint *in_RSI;
  Serializer *in_RDI;
  Serializer *unaff_retaddr;
  Serializer *value;
  
  value = in_RDI;
  Constraint::Serialize(in_RSI,in_RDI);
  Serializer::WritePropertyWithDefault<bool>
            (unaff_retaddr,(field_id_t)((ulong)value >> 0x30),(char *)in_RSI,(bool *)in_RDI);
  Serializer::WriteProperty<duckdb::LogicalIndex>
            ((Serializer *)this,serializer._6_2_,(char *)unaff_retaddr,(LogicalIndex *)value);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (unaff_retaddr,(field_id_t)((ulong)value >> 0x30),(char *)in_RSI,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)in_RDI);
  return;
}

Assistant:

void UniqueConstraint::Serialize(Serializer &serializer) const {
	Constraint::Serialize(serializer);
	serializer.WritePropertyWithDefault<bool>(200, "is_primary_key", is_primary_key);
	serializer.WriteProperty<LogicalIndex>(201, "index", index);
	serializer.WritePropertyWithDefault<vector<string>>(202, "columns", columns);
}